

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O2

void __thiscall OpenMD::NPT::moveA(NPT *this)

{
  Thermo *this_00;
  RotationAlgorithm *pRVar1;
  Molecule *pMVar2;
  pointer pVVar3;
  Molecule *pMVar4;
  ulong uVar5;
  pointer ppSVar6;
  long lVar7;
  double dVar8;
  long lVar9;
  StuntDouble *pSVar10;
  RealType RVar11;
  pair<double,_double> pVar12;
  MoleculeIterator i;
  Vector3d vel;
  Vector3d sc;
  Vector3d frc;
  Vector3d pos;
  Vector3d ji;
  Vector3d Tb;
  Vector3d COM;
  long local_190;
  MoleculeIterator local_188;
  Molecule *local_180;
  double local_178;
  pair<double,_double> *local_170;
  ulong local_168;
  Molecule *local_160;
  double local_158;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_188._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_150);
  Vector<double,_3U>::Vector(&local_c0);
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_f0);
  pVar12 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_170 = &this->thermostat;
  this->thermostat = pVar12;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  this_00 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar11 = Thermo::getTemperature(this_00);
  this->instaTemp = RVar11;
  Thermo::getPressureTensor((Mat3x3d *)&local_78,this_00);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&this->press,&local_78);
  this->instaPress =
       (((this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
         (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
        (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]) *
       163882576.0) / 3.0;
  RVar11 = Thermo::getVolume(this_00);
  this->instaVol = RVar11;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
  pMVar4 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
  while (pMVar4 != (Molecule *)0x0) {
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_180 = pMVar4;
    if (ppSVar6 !=
        (pMVar4->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00178be9;
    pSVar10 = (StuntDouble *)0x0;
    while (pSVar10 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_138,pSVar10);
      Vector<double,_3U>::operator=(&local_150,&local_138);
      StuntDouble::getFrc((Vector3d *)&local_138,pSVar10);
      Vector<double,_3U>::operator=(&local_d8,&local_138);
      local_178 = pSVar10->mass_;
      (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x10])
                (this,&local_f0,&local_150);
      operator*(&local_108,
                ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184) /
                local_178,&local_d8);
      operator*(&local_120,(this->super_VelocityVerletIntegrator).super_Integrator.dt2,&local_f0);
      operator-(&local_138,&local_108,&local_120);
      Vector<double,_3U>::add(&local_150,&local_138);
      StuntDouble::setVel(pSVar10,(Vector3d *)&local_150);
      if (pSVar10->objType_ - otDAtom < 2) {
        StuntDouble::getTrq((Vector3d *)&local_108,pSVar10);
        StuntDouble::lab2Body((Vector3d *)&local_138,pSVar10,(Vector3d *)&local_108);
        Vector<double,_3U>::operator=(&local_90,&local_138);
        StuntDouble::getJ((Vector3d *)&local_138,pSVar10);
        Vector<double,_3U>::operator=(&local_a8,&local_138);
        operator*(&local_108,(this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184
                  ,&local_90);
        operator*(&local_120,
                  (this->super_VelocityVerletIntegrator).super_Integrator.dt2 *
                  (this->thermostat).first,&local_a8);
        operator-(&local_138,&local_108,&local_120);
        Vector<double,_3U>::add(&local_a8,&local_138);
        pRVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
        (*pRVar1->_vptr_RotationAlgorithm[2])
                  ((this->super_VelocityVerletIntegrator).super_Integrator.dt,pRVar1,pSVar10,
                   &local_a8);
        StuntDouble::setJ(pSVar10,(Vector3d *)&local_a8);
      }
      ppSVar6 = ppSVar6 + 1;
      pSVar10 = (StuntDouble *)0x0;
      if (ppSVar6 !=
          (local_180->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00178be9:
        pSVar10 = *ppSVar6;
      }
    }
    pMVar4 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
  }
  (this->thermostat).first =
       ((this->instaTemp / this->targetTemp + -1.0) *
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 +
       (this->thermostat).first;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x15])(this);
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar4 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
  lVar7 = 0;
  while (pMVar4 != (Molecule *)0x0) {
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar6 ==
        (pMVar4->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar10 = (StuntDouble *)0x0;
    }
    else {
      pSVar10 = *ppSVar6;
    }
    lVar7 = (long)(int)lVar7;
    lVar9 = lVar7 * 0x18;
    while (ppSVar6 = ppSVar6 + 1, pSVar10 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_138,pSVar10);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)
                 ((long)(((this->oldPos).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar9),&local_138);
      if (ppSVar6 ==
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar10 = (StuntDouble *)0x0;
      }
      else {
        pSVar10 = *ppSVar6;
      }
      lVar9 = lVar9 + 0x18;
      lVar7 = lVar7 + 1;
    }
    pMVar4 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
  }
  uVar5 = 0;
  while ((int)uVar5 < this->maxIterNum_) {
    local_168 = uVar5;
    pMVar4 = SimInfo::beginMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
    dVar8 = 0.0;
    while (pMVar4 != (Molecule *)0x0) {
      pMVar2 = (Molecule *)
               (pMVar4->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pMVar2 == (Molecule *)
                    (pMVar4->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar10 = (StuntDouble *)0x0;
      }
      else {
        pSVar10 = (StuntDouble *)pMVar2->_vptr_Molecule;
      }
      dVar8 = (double)(long)SUB84(dVar8,0);
      local_190 = (long)dVar8 * 0x18;
      local_160 = pMVar4;
      while (pSVar10 != (StuntDouble *)0x0) {
        local_180 = (Molecule *)&pMVar2->globalIndex_;
        StuntDouble::getVel((Vector3d *)&local_138,pSVar10);
        Vector<double,_3U>::operator=(&local_150,&local_138);
        StuntDouble::getPos((Vector3d *)&local_138,pSVar10);
        Vector<double,_3U>::operator=(&local_c0,&local_138);
        local_178 = dVar8;
        (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x12])
                  (this,&local_c0,&local_78,(ulong)dVar8 & 0xffffffff,&local_f0);
        pVVar3 = (this->oldPos).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_158 = (this->super_VelocityVerletIntegrator).super_Integrator.dt;
        OpenMD::operator+(&local_120,&local_150,&local_f0);
        operator*(&local_108,local_158,&local_120);
        OpenMD::operator+(&local_138,
                          (Vector<double,_3U> *)
                          ((long)(pVVar3->super_Vector<double,_3U>).data_ + local_190),&local_108);
        Vector3<double>::operator=((Vector3<double> *)&local_c0,&local_138);
        StuntDouble::setPos(pSVar10,(Vector3d *)&local_c0);
        if (local_180 ==
            (Molecule *)
            (local_160->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar10 = (StuntDouble *)0x0;
        }
        else {
          pSVar10 = (StuntDouble *)local_180->_vptr_Molecule;
        }
        local_190 = local_190 + 0x18;
        dVar8 = (double)((long)local_178 + 1);
        pMVar2 = local_180;
      }
      pMVar4 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_188);
    }
    Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
    uVar5 = (ulong)((int)local_168 + 1);
  }
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x17])(this);
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_170);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    thermostat = snap->getThermostat();
    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve chi and eta  half step

    thermostat.first += dt2 * (instaTemp / targetTemp - 1.0) / tt2;

    evolveEtaA();

    // calculate the integral of chidt
    thermostat.second += dt2 * thermostat.first;

    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    snap->setThermostat(thermostat);

    saveEta();
  }